

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O0

FT_Error tt_get_metrics(TT_Loader loader,FT_UInt glyph_index)

{
  FT_ULong pos_00;
  FT_ULong pos;
  FT_UShort advance_height;
  FT_UShort advance_width;
  FT_Short top_bearing;
  FT_Short left_bearing;
  FT_Stream stream;
  TT_Face pTStack_28;
  FT_Error error;
  TT_Face face;
  TT_Loader pTStack_18;
  FT_UInt glyph_index_local;
  TT_Loader loader_local;
  
  pTStack_28 = loader->face;
  _advance_height = loader->stream;
  pos._6_2_ = 0;
  pos._4_2_ = 0;
  pos._2_2_ = 0;
  pos._0_2_ = 0;
  face._4_4_ = glyph_index;
  pTStack_18 = loader;
  pos_00 = FT_Stream_Pos(_advance_height);
  TT_Get_HMetrics(pTStack_28,face._4_4_,(FT_Short *)((long)&pos + 6),(FT_UShort *)((long)&pos + 2));
  TT_Get_VMetrics(pTStack_28,face._4_4_,(pTStack_18->bbox).yMax,(FT_Short *)((long)&pos + 4),
                  (FT_UShort *)&pos);
  loader_local._4_4_ = FT_Stream_Seek(_advance_height,pos_00);
  if (loader_local._4_4_ == 0) {
    pTStack_18->left_bearing = (int)pos._6_2_;
    pTStack_18->advance = (uint)pos._2_2_;
    pTStack_18->top_bearing = (int)pos._4_2_;
    pTStack_18->vadvance = (uint)(ushort)pos;
    if (pTStack_18->linear_def == '\0') {
      pTStack_18->linear_def = '\x01';
      pTStack_18->linear = (uint)pos._2_2_;
    }
    loader_local._4_4_ = 0;
  }
  return loader_local._4_4_;
}

Assistant:

static FT_Error
  tt_get_metrics( TT_Loader  loader,
                  FT_UInt    glyph_index )
  {
    TT_Face    face   = loader->face;
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    TT_Driver  driver = (TT_Driver)FT_FACE_DRIVER( face );
#endif

    FT_Error   error;
    FT_Stream  stream = loader->stream;

    FT_Short   left_bearing = 0, top_bearing = 0;
    FT_UShort  advance_width = 0, advance_height = 0;

    /* we must preserve the stream position          */
    /* (which gets altered by the metrics functions) */
    FT_ULong  pos = FT_STREAM_POS();


    TT_Get_HMetrics( face, glyph_index,
                     &left_bearing,
                     &advance_width );
    TT_Get_VMetrics( face, glyph_index,
                     loader->bbox.yMax,
                     &top_bearing,
                     &advance_height );

    if ( FT_STREAM_SEEK( pos ) )
      return error;

    loader->left_bearing = left_bearing;
    loader->advance      = advance_width;
    loader->top_bearing  = top_bearing;
    loader->vadvance     = advance_height;

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    if ( driver->interpreter_version == TT_INTERPRETER_VERSION_38 &&
         loader->exec                                             )
    {
      loader->exec->sph_tweak_flags = 0;

      /* This may not be the right place for this, but it works...  */
      /* Note that we have to unconditionally load the tweaks since */
      /* it is possible that glyphs individually switch ClearType's */
      /* backward compatibility mode on and off.                    */
      sph_set_tweaks( loader, glyph_index );
    }
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

    if ( !loader->linear_def )
    {
      loader->linear_def = 1;
      loader->linear     = advance_width;
    }

    return FT_Err_Ok;
  }